

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogUnixServer.cpp
# Opt level: O2

void __thiscall liblogger::LogUnixServer::Log(LogUnixServer *this,LogType Type,string *str)

{
  list<int,_std::allocator<int>_> *this_00;
  pointer pcVar1;
  uint uVar2;
  int iVar3;
  string *psVar4;
  size_t sVar5;
  ssize_t sVar6;
  int *piVar7;
  ostream *poVar8;
  char *pcVar9;
  LogException *this_01;
  _List_node_base *p_Var10;
  long lVar11;
  ssize_t offset;
  long lVar12;
  char *msg;
  LogUnixServer *local_2a8;
  int fd;
  time_t current;
  list<int,_std::allocator<int>_> broken;
  tm timeinfo;
  char buf [128];
  
  msg = (char *)0x0;
  current = time((time_t *)0x0);
  localtime_r(&current,(tm *)&timeinfo);
  strftime(buf,0x80,"%F %T",(tm *)&timeinfo);
  psVar4 = LogTypeToStr_abi_cxx11_(Type);
  pcVar1 = (psVar4->_M_dataplus)._M_p;
  uVar2 = getpid();
  iVar3 = asprintf(&msg,"%s - %s [PID: %d] - %s\n",buf,pcVar1,(ulong)uVar2,(str->_M_dataplus)._M_p);
  if (iVar3 < 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&broken);
    poVar8 = std::operator<<((ostream *)
                             &broken.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                              _M_size,"asprintf failed error:");
    piVar7 = __errno_location();
    pcVar9 = strerror(*piVar7);
    std::operator<<(poVar8,pcVar9);
    this_01 = (LogException *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    LogException::LogException(this_01,(string *)&fd);
    __cxa_throw(this_01,&LogException::typeinfo,LogException::~LogException);
  }
  broken.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base._M_next =
       (_List_node_base *)&broken;
  broken.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size = 0;
  broken.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base._M_prev =
       broken.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
       _M_next;
  sVar5 = strlen(msg);
  Lock(this);
  this_00 = &this->m_list;
  lVar11 = (long)(int)sVar5;
  p_Var10 = (_List_node_base *)this_00;
  local_2a8 = this;
  while (p_Var10 = (((_List_base<int,_std::allocator<int>_> *)&p_Var10->_M_next)->_M_impl)._M_node.
                   super__List_node_base._M_next, p_Var10 != (_List_node_base *)this_00) {
    fd = *(int *)&p_Var10[1]._M_next;
    lVar12 = 0;
    do {
      sVar6 = write(fd,msg + lVar12,lVar11 - lVar12);
      if (sVar6 < 0) {
        piVar7 = __errno_location();
        if (*piVar7 == 4) {
          sVar6 = 0;
        }
      }
      else {
        lVar12 = lVar12 + lVar11;
      }
    } while (lVar12 < lVar11);
    if (sVar6 < lVar11 || sVar6 == 0) {
      std::__cxx11::list<int,_std::allocator<int>_>::push_back(&broken,&fd);
    }
  }
  p_Var10 = (_List_node_base *)&broken;
  while( true ) {
    p_Var10 = (((_List_base<int,_std::allocator<int>_> *)&p_Var10->_M_next)->_M_impl)._M_node.
              super__List_node_base._M_next;
    if (p_Var10 == (_List_node_base *)&broken) {
      Unlock(local_2a8);
      std::__cxx11::_List_base<int,_std::allocator<int>_>::_M_clear
                (&broken.super__List_base<int,_std::allocator<int>_>);
      free(msg);
      return;
    }
    fd = *(int *)&p_Var10[1]._M_next;
    iVar3 = close(fd);
    if (iVar3 < 0) break;
    std::__cxx11::list<int,_std::allocator<int>_>::remove(this_00,(char *)&fd);
  }
  abort();
}

Assistant:

void LogUnixServer::Log(const LogType Type, const std::string &str) {
	char *msg = NULL;

	time_t current = time(NULL);
	struct tm timeinfo;
	char buf[128];

	localtime_r(&current, &timeinfo);
	strftime(buf, sizeof(buf), "%F %T", &timeinfo);

	if (asprintf(&msg, "%s - %s [PID: %d] - %s\n", buf, LogTypeToStr(Type).c_str(), getpid(), str.c_str()) < 0)
	{
		std::stringstream ss;
		ss << "asprintf failed error:" << strerror(errno);
		throw(LogException(ss.str()));
	}
	else
	{
		std::list<int> broken;
		int len = strlen(msg);

		Lock();

		for(auto fd : m_list)
		{
			ssize_t offset = 0;
			ssize_t ret = 0;
			do
			{
				ret = write(fd, msg + offset, len - offset);
				if (ret < 0)
				{
					switch(errno)
					{
						case EINTR:
							ret = 0; //Fudge this as if we didn't write anything
							break;
						default:
							break;
					}
				}
				else
				{
					offset += len;
				}
			} while(offset < len);

			if (ret < len || ret == 0)
			{
				broken.push_back(fd);
			}
		}

		//Kick any broken clients
		for(auto fd : broken)
		{
			if (close(fd) < 0)
			{
				abort();
			}
			m_list.remove(fd);
		}

		Unlock();

	}
	free(msg);
}